

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

void __thiscall Net::read_with_retry(Net *this,string *data)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  char r [32];
  
  iVar1 = BIO_read((BIO *)this->sock,r,0x20);
  if (iVar1 == 0) {
    pcVar3 = "recv error(conn closed)";
LAB_00107ddd:
    poVar2 = std::operator<<((ostream *)&std::cout,pcVar3);
    std::endl<char,std::char_traits<char>>(poVar2);
    this->closed = 1;
  }
  else {
    if (iVar1 < 0) {
      iVar1 = BIO_test_flags((BIO *)this->sock,8);
      if (iVar1 == 0) {
        pcVar3 = "recv error";
        goto LAB_00107ddd;
      }
    }
    std::__cxx11::string::append((char *)data);
  }
  return;
}

Assistant:

void Net::read_with_retry(std::string &data){
	char r[32];
	int ret;
	ret=BIO_read(sock,r,32);
	if(ret==0){
		std::cout<<"recv error(conn closed)"<<std::endl;
		closed=1;
		return;
	} else if(ret<0)
		if(!BIO_should_retry(sock)){
			std::cout<<"recv error"<<std::endl;
			closed=1;
			return;
		}
	data+=r;
}